

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-domain-socket-server.c
# Opt level: O1

int main(void)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  char *__s;
  socklen_t fromlen;
  sockaddr_un addr;
  sockaddr_un from;
  char buff [8192];
  socklen_t local_211c;
  sockaddr local_2118;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined6 uStack_20c0;
  undefined2 local_20ba;
  undefined6 uStack_20b8;
  undefined8 uStack_20b2;
  sockaddr local_20a6 [6];
  char local_2038 [8200];
  
  local_211c = 0x6e;
  __fd = socket(1,2,0);
  if (__fd < 0) {
    __s = "socket";
  }
  else {
    local_2118.sa_data[0xc] = '\0';
    local_2118.sa_data[0xd] = '\0';
    uStack_20b8 = 0;
    uStack_20b2 = 0;
    uStack_20c8 = 0;
    uStack_20c0 = 0;
    local_20ba = 0;
    local_20d8 = 0;
    uStack_20d0 = 0;
    local_20e8 = 0;
    uStack_20e0 = 0;
    local_20f8 = 0;
    uStack_20f0 = 0;
    local_2108 = 0;
    uStack_2100 = 0;
    local_2118.sa_family = 1;
    builtin_strncpy(local_2118.sa_data,"server.sock",0xc);
    unlink("server.sock");
    iVar1 = bind(__fd,&local_2118,0x6e);
    if (-1 < iVar1) goto LAB_00101259;
    __s = "bind";
  }
  perror(__s);
LAB_00101259:
  do {
    sVar2 = recvfrom(__fd,local_2038,0x2000,0,local_20a6,&local_211c);
    if ((int)sVar2 < 1) goto LAB_001012ee;
    printf("recvfrom: %s\n",local_2038);
    builtin_strncpy(local_2038,"transmit good!",0xf);
    sVar3 = strlen(local_2038);
    sVar2 = sendto(__fd,local_2038,sVar3 + 1,0,local_20a6,local_211c);
  } while (-1 < (int)sVar2);
  perror("sendto");
LAB_001012ee:
  if (-1 < __fd) {
    close(__fd);
  }
  return 0;
}

Assistant:

int main() {
    int fd;
    struct sockaddr_un addr;
    int ret;
    char buff[8192];
    struct sockaddr_un from;
    int ok = 1;
    int len;
    socklen_t fromlen = sizeof(from);
    
    //////********* UNIX domain  *********//////////
    ///// UNIX domain sockets are a method by which processes on the same host can communicate. 
    /////Communication is bidirectional with stream sockets and unidirectional with datagram sockets.
    
    // i.e fd = socket(AF_UNIX, SOCK_STREAM, 0);
    
    /// PF= Protocol family: Unix domain sockets  PF_UNIX=AF_UNIX
    //NOTE: SOCK_DGRAM socket datagram type communication.
    if ((fd = socket(PF_UNIX, SOCK_DGRAM, 0)) < 0) {
        perror("socket");
        ok = 0;
    }

    if (ok) {
        
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = server.sock
        strcpy(addr.sun_path, SERVER_SOCK_FILE);
        // unlink() - delete name and if it's possible the file which is referring for by the name.
        unlink(SERVER_SOCK_FILE);
        //// int bind (int fd, const struct sockaddr *addr, int addrlen)
        ////  link the socket using the file descriptor a local or a network Address, memorized into addr.
        if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
            perror("bind");
            ok = 0;
        }
    }
    
    /// With the SOCK SOCK_DGRAM option it's possibile use the recvfrom function with more details.
    ////ssize_t recvfrom(int sockfd, void *buf, size_t len, int flags, struct sockaddr *src_addr, socklen_t *addrlen);
    while ((len = recvfrom(fd, buff, 8192, 0, (struct sockaddr *)&from, &fromlen)) > 0) {
        printf ("recvfrom: %s\n", buff);
        strcpy (buff, "transmit good!");
        /// With the SOCK SOCK_DGRAM option it's possibile use the sendto function with more details.
        /// ssize_t sendto(int sockfd, const void *buf, size_t len, int flags,const struct sockaddr *dest_addr, socklen_t addrlen);
        ret = sendto(fd, buff, strlen(buff)+1, 0, (struct sockaddr *)&from, fromlen);
        if (ret < 0) {
            perror("sendto");
            break;
        }
    }
    

    if (fd >= 0) {
        close(fd);
    }

    return 0;
}